

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  void *pvVar1;
  Mem *p;
  u8 enc_local;
  sqlite3_value *pVal_local;
  
  if (((pVal->flags & 0x10) == 0) && (pvVar1 = sqlite3ValueText(pVal,enc), pvVar1 == (void *)0x0)) {
    return 0;
  }
  if ((pVal->flags & 0x4000) == 0) {
    pVal_local._4_4_ = pVal->n;
  }
  else {
    pVal_local._4_4_ = pVal->n + (pVal->u).nZero;
  }
  return pVal_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  if( (p->flags & MEM_Blob)!=0 || sqlite3ValueText(pVal, enc) ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  return 0;
}